

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_value_visit(BinTextReader *this,List2 *value)

{
  char *pcVar1;
  bool bVar2;
  char *start_2;
  char *start_1;
  char *start;
  List2 *pLStack_20;
  bool end;
  List2 *value_local;
  BinTextReader *this_local;
  
  start._7_1_ = 0;
  pcVar1 = (this->reader).cur_;
  pLStack_20 = value;
  value_local = (List2 *)this;
  bVar2 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&start + 7));
  if (bVar2) {
    do {
      if (((start._7_1_ ^ 0xff) & 1) == 0) {
        return true;
      }
      pcVar1 = (this->reader).cur_;
      bVar2 = read_element(this,&pLStack_20->items,pLStack_20->valueType);
      if (!bVar2) {
        bVar2 = fail_msg(this,"read_element(value.items, value.valueType)",pcVar1);
        return bVar2;
      }
      pcVar1 = (this->reader).cur_;
      bVar2 = TextReader::read_nested_separator_or_end(&this->reader,(bool *)((long)&start + 7));
    } while (bVar2);
    this_local._7_1_ = fail_msg(this,"reader.read_nested_separator_or_end(end)",pcVar1);
  }
  else {
    this_local._7_1_ = fail_msg(this,"reader.read_nested_begin(end)",pcVar1);
  }
  return this_local._7_1_;
}

Assistant:

bool read_value_visit(List2& value) noexcept {
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(read_element(value.items, value.valueType));
                bin_assert(reader.read_nested_separator_or_end(end));
            }
            return true;
        }